

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void __thiscall kj::Maybe<short>::Maybe<long_long>(Maybe<short> *this,Maybe<long_long> *other)

{
  Maybe<long_long> *maybe;
  NullableValue<long_long> *other_00;
  longlong *plVar1;
  longlong *val;
  undefined1 local_28 [8];
  NullableValue<long_long> _val1451;
  Maybe<long_long> *other_local;
  Maybe<short> *this_local;
  
  _val1451.field_1 = (anon_union_8_1_a8c68091_for_NullableValue<long_long>_2)other;
  _::NullableValue<short>::NullableValue(&this->ptr);
  maybe = mv<kj::Maybe<long_long>>((Maybe<long_long> *)_val1451.field_1);
  other_00 = _::readMaybe<long_long>(maybe);
  _::NullableValue<long_long>::NullableValue((NullableValue<long_long> *)local_28,other_00);
  plVar1 = _::NullableValue::operator_cast_to_long_long_((NullableValue *)local_28);
  if (plVar1 != (longlong *)0x0) {
    plVar1 = _::NullableValue<long_long>::operator*((NullableValue<long_long> *)local_28);
    plVar1 = mv<long_long>(plVar1);
    _::NullableValue<short>::emplace<long_long>(&this->ptr,plVar1);
    kj::Maybe<long_long>::operator=((Maybe<long_long> *)_val1451.field_1.value);
  }
  _::NullableValue<long_long>::~NullableValue((NullableValue<long_long> *)local_28);
  return;
}

Assistant:

Maybe(Maybe<U>&& other) {
    KJ_IF_SOME(val, kj::mv(other)) {
      ptr.emplace(kj::mv(val));
      other = kj::none;
    }
  }